

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O0

int mriStepInnerStepper_AllocVecs(MRIStepInnerStepper stepper,int count,N_Vector tmpl)

{
  int iVar1;
  void *pvVar2;
  N_Vector **in_RDX;
  int in_ESI;
  long in_RDI;
  long *unaff_retaddr;
  sunindextype liw1;
  sunindextype lrw1;
  MRIStepInnerStepper in_stack_ffffffffffffffc8;
  long *in_stack_ffffffffffffffd0;
  long *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe8;
  int local_4;
  
  if (in_RDI == 0) {
    local_4 = -0x16;
  }
  else {
    if (in_RDX[1][4] == (N_Vector)0x0) {
      in_stack_ffffffffffffffd8 = (long *)0x0;
      in_stack_ffffffffffffffd0 = (long *)0x0;
    }
    else {
      N_VSpace(in_RDX,&stack0xffffffffffffffd8,&stack0xffffffffffffffd0);
    }
    *(long **)(in_RDI + 0x50) = in_stack_ffffffffffffffd8;
    *(long **)(in_RDI + 0x58) = in_stack_ffffffffffffffd0;
    *(int *)(in_RDI + 0x20) = in_ESI;
    if (*(int *)(in_RDI + 0x24) < *(int *)(in_RDI + 0x20)) {
      if (*(int *)(in_RDI + 0x24) != 0) {
        arkFreeVecArray((int)((ulong)in_RDI >> 0x20),
                        (N_Vector **)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),(sunindextype)in_RDX
                        ,in_stack_ffffffffffffffd8,(sunindextype)in_stack_ffffffffffffffd0,
                        (long *)in_stack_ffffffffffffffc8);
      }
      in_stack_ffffffffffffffc8 = (MRIStepInnerStepper)(in_RDI + 0x68);
      iVar1 = arkAllocVecArray((int)in_RDI,(N_Vector)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                               in_RDX,(sunindextype)in_stack_ffffffffffffffd8,
                               in_stack_ffffffffffffffd0,(sunindextype)in_stack_ffffffffffffffc8,
                               unaff_retaddr);
      if (iVar1 == 0) {
        mriStepInnerStepper_FreeVecs(in_stack_ffffffffffffffc8);
        return -0x14;
      }
      *(undefined4 *)(in_RDI + 0x24) = *(undefined4 *)(in_RDI + 0x20);
    }
    if (*(long *)(in_RDI + 0x48) == 0) {
      pvVar2 = calloc((long)(in_ESI + 1),8);
      *(void **)(in_RDI + 0x48) = pvVar2;
      if (*(long *)(in_RDI + 0x48) == 0) {
        mriStepInnerStepper_FreeVecs(in_stack_ffffffffffffffc8);
        return -0x14;
      }
    }
    if (*(long *)(in_RDI + 0x40) == 0) {
      pvVar2 = calloc((long)(in_ESI + 1),8);
      *(void **)(in_RDI + 0x40) = pvVar2;
      if (*(long *)(in_RDI + 0x40) == 0) {
        mriStepInnerStepper_FreeVecs(in_stack_ffffffffffffffc8);
        return -0x14;
      }
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int mriStepInnerStepper_AllocVecs(MRIStepInnerStepper stepper, int count,
                                  N_Vector tmpl)
{
  sunindextype lrw1, liw1;

  if (stepper == NULL) { return ARK_ILL_INPUT; }

  /* Set space requirements for one N_Vector */
  if (tmpl->ops->nvspace) { N_VSpace(tmpl, &lrw1, &liw1); }
  else
  {
    lrw1 = 0;
    liw1 = 0;
  }
  stepper->lrw1 = lrw1;
  stepper->liw1 = liw1;

  /* Set the number of forcing vectors and allocate vectors */
  stepper->nforcing = count;

  if (stepper->nforcing_allocated < stepper->nforcing)
  {
    if (stepper->nforcing_allocated)
    {
      arkFreeVecArray(stepper->nforcing_allocated, &(stepper->forcing),
                      stepper->lrw1, &(stepper->lrw), stepper->liw1,
                      &(stepper->liw));
    }
    if (!arkAllocVecArray(stepper->nforcing, tmpl, &(stepper->forcing),
                          stepper->lrw1, &(stepper->lrw), stepper->liw1,
                          &(stepper->liw)))
    {
      mriStepInnerStepper_FreeVecs(stepper);
      return (ARK_MEM_FAIL);
    }
    stepper->nforcing_allocated = stepper->nforcing;
  }

  /* Allocate fused operation workspace arrays */
  if (stepper->vecs == NULL)
  {
    stepper->vecs = (N_Vector*)calloc(count + 1, sizeof(*stepper->vecs));
    if (stepper->vecs == NULL)
    {
      mriStepInnerStepper_FreeVecs(stepper);
      return (ARK_MEM_FAIL);
    }
  }

  if (stepper->vals == NULL)
  {
    stepper->vals = (sunrealtype*)calloc(count + 1, sizeof(*stepper->vals));
    if (stepper->vals == NULL)
    {
      mriStepInnerStepper_FreeVecs(stepper);
      return (ARK_MEM_FAIL);
    }
  }

  return (ARK_SUCCESS);
}